

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Own<capnp::LocalCallContext> __thiscall
kj::
refcounted<capnp::LocalCallContext,kj::Own<capnp::MallocMessageBuilder>,kj::Own<capnp::ClientHook>,kj::Own<kj::PromiseFulfiller<void>>>
          (kj *this,Own<capnp::MallocMessageBuilder> *params,Own<capnp::ClientHook> *params_1,
          Own<kj::PromiseFulfiller<void>_> *params_2)

{
  LocalCallContext *this_00;
  Own<capnp::MallocMessageBuilder> *request;
  Own<capnp::ClientHook> *other;
  Own<kj::PromiseFulfiller<void>_> *other_00;
  LocalCallContext *extraout_RDX;
  Own<capnp::LocalCallContext> OVar1;
  Own<kj::PromiseFulfiller<void>_> local_48;
  Own<capnp::ClientHook> local_38;
  Own<kj::PromiseFulfiller<void>_> *local_28;
  Own<kj::PromiseFulfiller<void>_> *params_local_2;
  Own<capnp::ClientHook> *params_local_1;
  Own<capnp::MallocMessageBuilder> *params_local;
  
  local_28 = params_2;
  params_local_2 = (Own<kj::PromiseFulfiller<void>_> *)params_1;
  params_local_1 = (Own<capnp::ClientHook> *)params;
  params_local = (Own<capnp::MallocMessageBuilder> *)this;
  this_00 = (LocalCallContext *)operator_new(0xa8);
  request = fwd<kj::Own<capnp::MallocMessageBuilder>>
                      ((NoInfer<kj::Own<capnp::MallocMessageBuilder>_> *)params_local_1);
  other = fwd<kj::Own<capnp::ClientHook>>((NoInfer<kj::Own<capnp::ClientHook>_> *)params_local_2);
  Own<capnp::ClientHook>::Own(&local_38,other);
  other_00 = fwd<kj::Own<kj::PromiseFulfiller<void>>>(local_28);
  Own<kj::PromiseFulfiller<void>_>::Own(&local_48,other_00);
  capnp::LocalCallContext::LocalCallContext(this_00,request,&local_38,&local_48);
  Refcounted::addRefInternal<capnp::LocalCallContext>((Refcounted *)this,this_00);
  Own<kj::PromiseFulfiller<void>_>::~Own(&local_48);
  Own<capnp::ClientHook>::~Own(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}